

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::FilterCombiner::FindTransitiveFilter(FilterCombiner *this,Expression *expr)

{
  ExpressionType *this_00;
  char cVar1;
  reference pvVar2;
  pointer pEVar3;
  BoundComparisonExpression *pBVar4;
  long *in_RDX;
  pointer *__ptr;
  size_type __n;
  
  if (((char)in_RDX[1] == -0x1c) &&
     ((expr->super_BaseExpression).alias._M_dataplus._M_p !=
      *(pointer *)&(expr->super_BaseExpression).type)) {
    this_00 = &(expr->super_BaseExpression).type;
    __n = 0;
    do {
      pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                             *)this_00,__n);
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar2);
      if ((pEVar3->super_BaseExpression).expression_class == BOUND_COMPARISON) {
        pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                               *)this_00,__n);
        pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar2);
        pBVar4 = BaseExpression::Cast<duckdb::BoundComparisonExpression>
                           (&pEVar3->super_BaseExpression);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                  (&pBVar4->right);
        cVar1 = (**(code **)(*in_RDX + 0x50))();
        if ((cVar1 != '\0') &&
           ((pBVar4->super_Expression).super_BaseExpression.type != COMPARE_NOTEQUAL)) {
          pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                 *)this_00,__n);
          this->context =
               (ClientContext *)
               (pvVar2->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pvVar2->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          ::erase_at((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      *)this_00,__n);
          return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
        }
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(expr->super_BaseExpression).alias._M_dataplus._M_p -
                           *(long *)&(expr->super_BaseExpression).type >> 3));
  }
  this->context = (ClientContext *)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> FilterCombiner::FindTransitiveFilter(Expression &expr) {
	// We only check for bound column ref
	if (expr.GetExpressionType() != ExpressionType::BOUND_COLUMN_REF) {
		return nullptr;
	}
	for (idx_t i = 0; i < remaining_filters.size(); i++) {
		if (remaining_filters[i]->GetExpressionClass() == ExpressionClass::BOUND_COMPARISON) {
			auto &comparison = remaining_filters[i]->Cast<BoundComparisonExpression>();
			if (expr.Equals(*comparison.right) && comparison.GetExpressionType() != ExpressionType::COMPARE_NOTEQUAL) {
				auto filter = std::move(remaining_filters[i]);
				remaining_filters.erase_at(i);
				return filter;
			}
		}
	}
	return nullptr;
}